

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  bool bVar1;
  CppType CVar2;
  uint uVar3;
  uint32 uVar4;
  Type TVar5;
  LogMessage *pLVar6;
  protobuf *ppVar7;
  char *pcVar8;
  string *psVar9;
  EnumValueDescriptor *this_00;
  int i;
  uint i_00;
  long i_01;
  unsigned_long i_02;
  float value;
  double value_00;
  allocator local_12a;
  LogFinisher local_129;
  LogMessage local_128;
  LogFinisher local_e9;
  LogMessage local_e8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_6e;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  byte local_19;
  FieldDescriptor *pFStack_18;
  bool quote_string_type_local;
  FieldDescriptor *this_local;
  
  pLVar6 = (LogMessage *)this;
  local_19 = quote_string_type;
  pFStack_18 = this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = has_default_value(this);
  local_59 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x729);
    local_59 = 1;
    pLVar6 = internal::LogMessage::operator<<(&local_58,"CHECK failed: has_default_value(): ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,"No default value");
    internal::LogFinisher::operator=(local_6d,pLVar6);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  CVar2 = cpp_type(this);
  switch(CVar2) {
  case CPPTYPE_INT32:
    uVar3 = default_value_int32(this);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar3,i);
    break;
  case CPPTYPE_INT64:
    ppVar7 = (protobuf *)default_value_int64(this);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,ppVar7,i_01);
    break;
  case CPPTYPE_UINT32:
    uVar4 = default_value_uint32(this);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar4,i_00);
    break;
  case CPPTYPE_UINT64:
    ppVar7 = (protobuf *)default_value_uint64(this);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,ppVar7,i_02);
    break;
  case CPPTYPE_DOUBLE:
    value_00 = default_value_double(this);
    SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar6,value_00);
    break;
  case CPPTYPE_FLOAT:
    value = default_value_float(this);
    SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar6,value);
    break;
  case CPPTYPE_BOOL:
    bVar1 = default_value_bool(this);
    pcVar8 = "false";
    if (bVar1) {
      pcVar8 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar8,&local_6e);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e);
    break;
  case CPPTYPE_ENUM:
    this_00 = default_value_enum(this);
    psVar9 = EnumValueDescriptor::name_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar9);
    break;
  case CPPTYPE_STRING:
    if ((local_19 & 1) == 0) {
      TVar5 = type(this);
      if (TVar5 == TYPE_BYTES) {
        psVar9 = default_value_string_abi_cxx11_(this);
        CEscape(__return_storage_ptr__,psVar9);
      }
      else {
        psVar9 = default_value_string_abi_cxx11_(this);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar9);
      }
    }
    else {
      psVar9 = default_value_string_abi_cxx11_(this);
      CEscape(&local_b0,psVar9);
      std::operator+(&local_90,"\"",&local_b0);
      std::operator+(__return_storage_ptr__,&local_90,"\"");
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    break;
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x74f);
    pLVar6 = internal::LogMessage::operator<<(&local_e8,"Messages can\'t have default values!");
    internal::LogFinisher::operator=(&local_e9,pLVar6);
    internal::LogMessage::~LogMessage(&local_e8);
  default:
    internal::LogMessage::LogMessage
              (&local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x752);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_128,"Can\'t get here: failed to get default value as string");
    internal::LogFinisher::operator=(&local_129,pLVar6);
    internal::LogMessage::~LogMessage(&local_128);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_12a);
    std::allocator<char>::~allocator((allocator<char> *)&local_12a);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::DefaultValueAsString(bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return SimpleItoa(default_value_int32());
      break;
    case CPPTYPE_INT64:
      return SimpleItoa(default_value_int64());
      break;
    case CPPTYPE_UINT32:
      return SimpleItoa(default_value_uint32());
      break;
    case CPPTYPE_UINT64:
      return SimpleItoa(default_value_uint64());
      break;
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
      break;
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
      break;
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
      break;
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
      break;
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
      break;
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}